

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_get_proc_index(Integer g_a,Integer iproc,Integer *index)

{
  short sVar1;
  long lVar2;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  Integer _ndim_1;
  Integer _i_1;
  Integer _itmp_1;
  Integer _ndim;
  Integer _i;
  Integer _itmp;
  Integer ga_handle;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  long local_48;
  long local_40;
  long local_30;
  long local_28;
  
  lVar2 = in_RDI + 1000;
  if (GA[lVar2].distr_type == 2) {
    sVar1 = GA[lVar2].ndim;
    *in_RDX = in_RSI % (long)GA[lVar2].nblock[0];
    local_28 = in_RSI;
    for (local_30 = 1; local_30 < sVar1; local_30 = local_30 + 1) {
      local_28 = (local_28 - in_RDX[local_30 + -1]) / (long)GA[lVar2].nblock[local_30 + -1];
      in_RDX[local_30] = local_28 % (long)GA[lVar2].nblock[local_30];
    }
  }
  else if ((GA[lVar2].distr_type == 3) || (GA[lVar2].distr_type == 4)) {
    sVar1 = GA[lVar2].ndim;
    *in_RDX = in_RSI % (long)GA[lVar2].nblock[0];
    local_40 = in_RSI;
    for (local_48 = 1; local_48 < sVar1; local_48 = local_48 + 1) {
      local_40 = (local_40 - in_RDX[local_48 + -1]) / (long)GA[lVar2].nblock[local_48 + -1];
      in_RDX[local_48] = local_40 % (long)GA[lVar2].nblock[local_48];
    }
  }
  else {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  return;
}

Assistant:

void pnga_get_proc_index(Integer g_a, Integer iproc, Integer *index)
{
  Integer ga_handle = GA_OFFSET + g_a;
  if (GA[ga_handle].distr_type == SCALAPACK) {
    gam_find_proc_indices(ga_handle, iproc, index);
  } else if (GA[ga_handle].distr_type == TILED ||
      GA[ga_handle].distr_type == TILED_IRREG) {
    gam_find_tile_proc_indices(ga_handle, iproc, index);
  } else {
    pnga_error("Global array does not use ScaLAPACK data distribution",0);
  }
  return;
}